

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

string * __thiscall camp::Enum::name_abi_cxx11_(Enum *this,long value)

{
  iterator iVar1;
  EnumValueNotFound *__return_storage_ptr__;
  long local_b8;
  string local_b0;
  string local_90;
  EnumValueNotFound local_70;
  
  local_b8 = value;
  iVar1 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_std::less<long>,_boost::multi_index::detail::nth_layer<2,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Val,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::find<long>((ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_std::less<long>,_boost::multi_index::detail::nth_layer<2,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Val,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)&(this->m_pairs).super_type,&local_b8);
  if ((random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>
       *)iVar1.node !=
      (this->m_pairs).
      super_header_holder<boost::multi_index::detail::random_access_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>_*,_boost::multi_index::multi_index_container<camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>_>
      .member) {
    return (string *)iVar1.node;
  }
  __return_storage_ptr__ = (EnumValueNotFound *)__cxa_allocate_exception(0x48);
  EnumValueNotFound::EnumValueNotFound(&local_70,local_b8,&this->m_name);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"const std::string &camp::Enum::name(long) const","");
  Error::prepare<camp::EnumValueNotFound>(__return_storage_ptr__,&local_70,&local_b0,0x54,&local_90)
  ;
  __cxa_throw(__return_storage_ptr__,&EnumValueNotFound::typeinfo,Error::~Error);
}

Assistant:

const std::string& Enum::name(long value) const
{
    const ValueIndex& values = m_pairs.get<Val>();

    ValueIndex::const_iterator it = values.find(value);
    if (it == values.end())
        CAMP_ERROR(EnumValueNotFound(value, name()));

    return it->name;
}